

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

char * loguru::home_dir(void)

{
  char *pcVar1;
  
  pcVar1 = getenv("HOME");
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  home_dir();
}

Assistant:

const char* home_dir()
	{
		#ifdef _WIN32
			char* user_profile;
			size_t len;
			errno_t err = _dupenv_s(&user_profile, &len, "USERPROFILE");
			CHECK_F(err != 0, "Missing USERPROFILE");
			return user_profile;
		#else // _WIN32
			auto home = getenv("HOME");
			CHECK_F(home != nullptr, "Missing HOME");
			return home;
		#endif // _WIN32
	}